

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O1

int BZ2_bzDecompress(bz_stream *strm)

{
  uint *puVar1;
  ushort uVar2;
  ushort uVar3;
  DState *s;
  UInt16 *pUVar4;
  UInt32 *pUVar5;
  int iVar6;
  uint uVar7;
  Int32 IVar8;
  bz_stream *pbVar9;
  long lVar10;
  Int32 na;
  Int32 na_1;
  uint uVar11;
  uint uVar12;
  UChar *pUVar13;
  int iVar14;
  Int32 IVar15;
  Int32 na_9;
  uint uVar16;
  int iVar17;
  UInt32 UVar18;
  ulong uVar19;
  Int32 na_8;
  uint uVar20;
  int iVar21;
  Int32 na_7;
  Int32 na_6;
  uint uVar22;
  UInt32 UVar23;
  UChar UVar24;
  uint uVar25;
  bool bVar26;
  int local_40;
  
  iVar14 = -2;
  if (((strm != (bz_stream *)0x0) && (s = (DState *)strm->state, s != (DState *)0x0)) &&
     (s->strm == strm)) {
    do {
      do {
        if (s->state == 2) {
          if (s->smallDecompress == '\0') {
            if (s->blockRandomised == '\0') {
              UVar23 = s->calculatedBlockCRC;
              IVar8 = s->state_out_len;
              pUVar5 = s->tt;
              uVar19 = (ulong)s->tPos;
              pUVar13 = (UChar *)s->strm->next_out;
              uVar25 = s->strm->avail_out;
              iVar14 = s->save_nblock;
              iVar6 = iVar14 + 1;
              uVar7 = s->blockSize100k * 100000;
              uVar22 = s->k0;
              uVar20 = uVar25;
              IVar15 = s->nblock_used;
              uVar11 = (uint)s->state_out_ch;
              while( true ) {
                iVar17 = IVar15;
                UVar24 = (UChar)uVar11;
                UVar18 = (UInt32)uVar19;
                uVar12 = uVar22;
                if (IVar8 < 1) goto LAB_0049e1a9;
                if (uVar20 == 0) break;
                lVar10 = 0;
                while (IVar8 + -1 != (int)lVar10) {
                  pUVar13[lVar10] = UVar24;
                  UVar23 = UVar23 << 8 ^ BZ2_crc32Table[UVar23 >> 0x18 ^ uVar11 & 0xff];
                  lVar10 = lVar10 + 1;
                  if (uVar20 == (uint)lVar10) {
                    pUVar13 = pUVar13 + lVar10;
                    IVar8 = IVar8 - (uint)lVar10;
                    goto LAB_0049e2c4;
                  }
                }
                uVar20 = uVar20 - (int)lVar10;
                pUVar13 = pUVar13 + lVar10;
                IVar8 = iVar17;
                uVar12 = uVar11;
                do {
                  iVar17 = IVar8;
                  UVar24 = (UChar)uVar12;
                  UVar18 = (UInt32)uVar19;
                  if (uVar20 == 0) {
                    uVar20 = 0;
                    IVar8 = 1;
                    goto LAB_0049e2ce;
                  }
                  *pUVar13 = UVar24;
                  UVar23 = UVar23 << 8 ^ BZ2_crc32Table[uVar12 & 0xff ^ UVar23 >> 0x18];
                  pUVar13 = pUVar13 + 1;
                  uVar20 = uVar20 - 1;
                  uVar12 = uVar22;
LAB_0049e1a9:
                  UVar18 = (UInt32)uVar19;
                  if (iVar17 != iVar6 && iVar6 <= iVar17) {
                    return -4;
                  }
                  if (iVar17 == iVar6) {
                    IVar8 = 0;
                    uVar22 = uVar12;
                    goto LAB_0049e2ce;
                  }
                  if (uVar7 <= UVar18) {
                    return -4;
                  }
                  uVar22 = pUVar5[uVar19] & 0xff;
                  uVar11 = pUVar5[uVar19] >> 8;
                  uVar19 = (ulong)uVar11;
                  IVar8 = iVar17 + 1;
                } while ((uVar22 != uVar12) || (uVar22 = uVar12, iVar17 == iVar14));
                if (uVar7 <= uVar11) {
                  return -4;
                }
                puVar1 = pUVar5 + uVar19;
                uVar16 = *puVar1 >> 8;
                uVar19 = (ulong)uVar16;
                IVar15 = iVar17 + 2;
                IVar8 = 2;
                uVar11 = uVar12;
                if ((IVar15 != iVar6) && (uVar22 = *puVar1 & 0xff, uVar22 == uVar12)) {
                  if (uVar7 <= uVar16) {
                    return -4;
                  }
                  puVar1 = pUVar5 + uVar19;
                  uVar16 = *puVar1 >> 8;
                  uVar19 = (ulong)uVar16;
                  IVar15 = iVar17 + 3;
                  IVar8 = 3;
                  uVar22 = uVar12;
                  if ((IVar15 != iVar6) && (uVar22 = *puVar1 & 0xff, uVar22 == uVar12)) {
                    if (uVar7 <= uVar16) {
                      return -4;
                    }
                    uVar12 = pUVar5[uVar19] >> 8;
                    if (uVar7 <= uVar12) {
                      return -4;
                    }
                    IVar8 = (pUVar5[uVar19] & 0xff) + 4;
                    uVar22 = pUVar5[uVar12] & 0xff;
                    uVar19 = (ulong)(pUVar5[uVar12] >> 8);
                    IVar15 = iVar17 + 5;
                  }
                }
              }
LAB_0049e2c4:
              uVar20 = 0;
LAB_0049e2ce:
              pbVar9 = s->strm;
              uVar25 = uVar25 - uVar20;
              puVar1 = &pbVar9->total_out_lo32;
              uVar11 = *puVar1;
              *puVar1 = *puVar1 + uVar25;
              if (CARRY4(uVar11,uVar25)) {
                pbVar9->total_out_hi32 = pbVar9->total_out_hi32 + 1;
              }
              s->calculatedBlockCRC = UVar23;
              s->state_out_ch = UVar24;
              s->state_out_len = IVar8;
              s->nblock_used = iVar17;
              s->k0 = uVar22;
              s->tt = pUVar5;
              s->tPos = UVar18;
              pbVar9->next_out = (char *)pUVar13;
              pbVar9->avail_out = uVar20;
            }
            else {
              while (pbVar9 = s->strm, pbVar9->avail_out != 0) {
                while (s->state_out_len != 0) {
                  *pbVar9->next_out = s->state_out_ch;
                  s->calculatedBlockCRC =
                       s->calculatedBlockCRC << 8 ^
                       BZ2_crc32Table[(uint)s->state_out_ch ^ s->calculatedBlockCRC >> 0x18];
                  s->state_out_len = s->state_out_len + -1;
                  pbVar9 = s->strm;
                  pbVar9->next_out = pbVar9->next_out + 1;
                  uVar25 = pbVar9->avail_out - 1;
                  pbVar9->avail_out = uVar25;
                  puVar1 = &pbVar9->total_out_lo32;
                  *puVar1 = *puVar1 + 1;
                  if (*puVar1 == 0) {
                    pbVar9->total_out_hi32 = pbVar9->total_out_hi32 + 1;
                  }
                  if (uVar25 == 0) goto LAB_0049e310;
                }
                iVar6 = s->nblock_used;
                iVar17 = s->save_nblock;
                iVar14 = iVar17 + 1;
                if (iVar6 == iVar14) break;
                if (iVar6 != iVar14 && iVar14 <= iVar6) {
                  return -4;
                }
                s->state_out_len = 1;
                uVar25 = s->k0;
                s->state_out_ch = (UChar)uVar25;
                uVar22 = s->blockSize100k * 100000;
                if (uVar22 <= s->tPos) {
                  return -4;
                }
                pUVar5 = s->tt;
                uVar20 = pUVar5[s->tPos];
                uVar11 = uVar20 >> 8;
                s->tPos = uVar11;
                if (s->rNToGo == 0) {
                  s->rNToGo = BZ2_rNums[s->rTPos];
                  IVar8 = s->rTPos + 1;
                  if (IVar8 == 0x200) {
                    IVar8 = 0;
                  }
                  s->rTPos = IVar8;
                }
                iVar14 = s->rNToGo + -1;
                s->rNToGo = iVar14;
                s->nblock_used = iVar6 + 1;
                if (iVar6 != iVar17) {
                  uVar20 = uVar20 & 0xff ^ (uint)(iVar14 == 1);
                  if (uVar20 == uVar25) {
                    s->state_out_len = 2;
                    if (uVar22 <= uVar11) {
                      return -4;
                    }
                    uVar20 = pUVar5[uVar11];
                    uVar11 = uVar20 >> 8;
                    s->tPos = uVar11;
                    if (iVar14 == 0) {
                      s->rNToGo = BZ2_rNums[s->rTPos];
                      IVar8 = s->rTPos + 1;
                      if (IVar8 == 0x200) {
                        IVar8 = 0;
                      }
                      s->rTPos = IVar8;
                    }
                    iVar14 = s->rNToGo + -1;
                    s->rNToGo = iVar14;
                    s->nblock_used = iVar6 + 2;
                    if (iVar6 + 1 != iVar17) {
                      uVar20 = uVar20 & 0xff ^ (uint)(iVar14 == 1);
                      if (uVar20 == uVar25) {
                        s->state_out_len = 3;
                        if (uVar22 <= uVar11) {
                          return -4;
                        }
                        uVar20 = pUVar5[uVar11];
                        uVar11 = uVar20 >> 8;
                        s->tPos = uVar11;
                        if (iVar14 == 0) {
                          s->rNToGo = BZ2_rNums[s->rTPos];
                          IVar8 = s->rTPos + 1;
                          if (IVar8 == 0x200) {
                            IVar8 = 0;
                          }
                          s->rTPos = IVar8;
                        }
                        iVar14 = s->rNToGo + -1;
                        s->rNToGo = iVar14;
                        s->nblock_used = iVar6 + 3;
                        if (iVar6 + 2 != iVar17) {
                          uVar20 = uVar20 & 0xff ^ (uint)(iVar14 == 1);
                          if (uVar20 == uVar25) {
                            if (uVar22 <= uVar11) {
                              return -4;
                            }
                            uVar25 = pUVar5[uVar11];
                            uVar20 = uVar25 >> 8;
                            s->tPos = uVar20;
                            if (iVar14 == 0) {
                              s->rNToGo = BZ2_rNums[s->rTPos];
                              IVar8 = s->rTPos + 1;
                              if (IVar8 == 0x200) {
                                IVar8 = 0;
                              }
                              s->rTPos = IVar8;
                            }
                            iVar14 = s->rNToGo + -1;
                            s->rNToGo = iVar14;
                            s->nblock_used = iVar6 + 4;
                            s->state_out_len = (uVar25 & 0xff ^ (uint)(iVar14 == 1)) + 4;
                            if (uVar22 <= uVar20) {
                              return -4;
                            }
                            uVar25 = pUVar5[uVar20];
                            uVar22 = uVar25 & 0xff;
                            s->k0 = uVar22;
                            s->tPos = uVar25 >> 8;
                            if (iVar14 == 0) {
                              s->rNToGo = BZ2_rNums[s->rTPos];
                              IVar8 = s->rTPos + 1;
                              if (IVar8 == 0x200) {
                                IVar8 = 0;
                              }
                              s->rTPos = IVar8;
                            }
                            iVar14 = s->rNToGo + -1;
                            s->rNToGo = iVar14;
                            s->k0 = uVar22 ^ iVar14 == 1;
                            s->nblock_used = iVar6 + 5;
                          }
                          else {
                            s->k0 = uVar20;
                          }
                        }
                      }
                      else {
                        s->k0 = uVar20;
                      }
                    }
                  }
                  else {
                    s->k0 = uVar20;
                  }
                }
              }
            }
          }
          else {
            pbVar9 = s->strm;
            uVar25 = pbVar9->avail_out;
            if (s->blockRandomised == '\0') {
              while (uVar25 != 0) {
                while (s->state_out_len == 0) {
                  iVar6 = s->nblock_used;
                  iVar17 = s->save_nblock;
                  iVar14 = iVar17 + 1;
                  if (iVar6 == iVar14) goto LAB_0049e310;
                  if (iVar6 != iVar14 && iVar14 <= iVar6) {
                    return -4;
                  }
                  s->state_out_len = 1;
                  uVar25 = s->tPos;
                  uVar22 = s->k0;
                  s->state_out_ch = (UChar)uVar22;
                  uVar20 = s->blockSize100k * 100000;
                  if (uVar20 <= uVar25) {
                    return -4;
                  }
                  uVar11 = 0;
                  uVar7 = 0x100;
                  do {
                    uVar16 = (int)(uVar11 + uVar7) >> 1;
                    uVar12 = uVar16;
                    if (s->cftab[(int)uVar16] <= (int)uVar25) {
                      uVar12 = uVar7;
                      uVar11 = uVar16;
                    }
                    uVar7 = uVar12;
                  } while (uVar7 - uVar11 != 1);
                  pUVar4 = s->ll16;
                  pUVar13 = s->ll4;
                  uVar2 = pUVar4[uVar25];
                  uVar25 = (pUVar13[uVar25 >> 1] >> ((char)uVar25 * '\x04' & 4U) & 0xf) << 0x10 |
                           (uint)uVar2;
                  s->tPos = uVar25;
                  s->nblock_used = iVar6 + 1;
                  if (iVar6 != iVar17) {
                    if ((uVar11 & 0xff) == uVar22) {
                      s->state_out_len = 2;
                      if (uVar20 <= uVar25) {
                        return -4;
                      }
                      uVar11 = 0;
                      uVar7 = 0x100;
                      do {
                        uVar16 = (int)(uVar11 + uVar7) >> 1;
                        uVar12 = uVar16;
                        if (s->cftab[(int)uVar16] <= (int)uVar25) {
                          uVar12 = uVar7;
                          uVar11 = uVar16;
                        }
                        uVar7 = uVar12;
                      } while (uVar7 - uVar11 != 1);
                      uVar3 = pUVar4[uVar25];
                      uVar25 = (pUVar13[uVar25 >> 1] >> (((byte)uVar2 & 1) << 2) & 0xf) << 0x10 |
                               (uint)uVar3;
                      s->tPos = uVar25;
                      s->nblock_used = iVar6 + 2;
                      if (iVar6 + 1 != iVar17) {
                        if ((uVar11 & 0xff) == uVar22) {
                          s->state_out_len = 3;
                          if (uVar20 <= uVar25) {
                            return -4;
                          }
                          uVar11 = 0;
                          uVar7 = 0x100;
                          do {
                            uVar16 = (int)(uVar11 + uVar7) >> 1;
                            uVar12 = uVar16;
                            if (s->cftab[(int)uVar16] <= (int)uVar25) {
                              uVar12 = uVar7;
                              uVar11 = uVar16;
                            }
                            uVar7 = uVar12;
                          } while (uVar7 - uVar11 != 1);
                          uVar2 = pUVar4[uVar25];
                          uVar25 = (pUVar13[uVar25 >> 1] >> (((byte)uVar3 & 1) << 2) & 0xf) << 0x10
                                   | (uint)uVar2;
                          s->tPos = uVar25;
                          s->nblock_used = iVar6 + 3;
                          if (iVar6 + 2 != iVar17) {
                            if ((uVar11 & 0xff) == uVar22) {
                              if (uVar20 <= uVar25) {
                                return -4;
                              }
                              uVar22 = 0;
                              uVar11 = 0x100;
                              do {
                                uVar12 = (int)(uVar22 + uVar11) >> 1;
                                uVar7 = uVar12;
                                if (s->cftab[(int)uVar12] <= (int)uVar25) {
                                  uVar7 = uVar11;
                                  uVar22 = uVar12;
                                }
                                uVar11 = uVar7;
                              } while (uVar11 - uVar22 != 1);
                              uVar3 = pUVar4[uVar25];
                              uVar25 = (pUVar13[uVar25 >> 1] >> (((byte)uVar2 & 1) << 2) & 0xf) <<
                                       0x10 | (uint)uVar3;
                              s->tPos = uVar25;
                              s->nblock_used = iVar6 + 4;
                              s->state_out_len = (uVar22 & 0xff) + 4;
                              if (uVar20 <= uVar25) {
                                return -4;
                              }
                              iVar14 = 0;
                              iVar17 = 0x100;
                              do {
                                iVar21 = iVar14 + iVar17 >> 1;
                                if (s->cftab[iVar21] <= (int)uVar25) {
                                  iVar14 = iVar21;
                                  iVar21 = iVar17;
                                }
                                iVar17 = iVar21;
                              } while (iVar17 - iVar14 != 1);
                              s->k0 = iVar14;
                              s->tPos = (pUVar13[uVar25 >> 1] >> (((byte)uVar3 & 1) << 2) & 0xf) <<
                                        0x10 | (uint)pUVar4[uVar25];
                              s->nblock_used = iVar6 + 5;
                            }
                            else {
                              s->k0 = uVar11 & 0xff;
                            }
                          }
                        }
                        else {
                          s->k0 = uVar11 & 0xff;
                        }
                      }
                    }
                    else {
                      s->k0 = uVar11 & 0xff;
                    }
                  }
                  pbVar9 = s->strm;
                  if (pbVar9->avail_out == 0) goto LAB_0049e310;
                }
                *pbVar9->next_out = s->state_out_ch;
                s->calculatedBlockCRC =
                     s->calculatedBlockCRC << 8 ^
                     BZ2_crc32Table[(uint)s->state_out_ch ^ s->calculatedBlockCRC >> 0x18];
                s->state_out_len = s->state_out_len + -1;
                pbVar9 = s->strm;
                pbVar9->next_out = pbVar9->next_out + 1;
                uVar25 = pbVar9->avail_out - 1;
                pbVar9->avail_out = uVar25;
                puVar1 = &pbVar9->total_out_lo32;
                *puVar1 = *puVar1 + 1;
                if (*puVar1 == 0) {
                  pbVar9->total_out_hi32 = pbVar9->total_out_hi32 + 1;
                }
              }
            }
            else {
              while (uVar25 != 0) {
                while (s->state_out_len == 0) {
                  iVar6 = s->nblock_used;
                  iVar17 = s->save_nblock;
                  iVar14 = iVar17 + 1;
                  if (iVar6 == iVar14) goto LAB_0049e310;
                  if (iVar6 != iVar14 && iVar14 <= iVar6) {
                    return -4;
                  }
                  s->state_out_len = 1;
                  uVar25 = s->tPos;
                  uVar22 = s->k0;
                  s->state_out_ch = (UChar)uVar22;
                  uVar20 = s->blockSize100k * 100000;
                  if (uVar20 <= uVar25) {
                    return -4;
                  }
                  uVar11 = 0;
                  uVar7 = 0x100;
                  do {
                    uVar16 = (int)(uVar11 + uVar7) >> 1;
                    uVar12 = uVar16;
                    if (s->cftab[(int)uVar16] <= (int)uVar25) {
                      uVar12 = uVar7;
                      uVar11 = uVar16;
                    }
                    uVar7 = uVar12;
                  } while (uVar7 - uVar11 != 1);
                  pUVar13 = s->ll4;
                  pUVar4 = s->ll16;
                  uVar2 = pUVar4[uVar25];
                  uVar25 = (pUVar13[uVar25 >> 1] >> ((char)uVar25 * '\x04' & 4U) & 0xf) << 0x10 |
                           (uint)uVar2;
                  s->tPos = uVar25;
                  if (s->rNToGo == 0) {
                    s->rNToGo = BZ2_rNums[s->rTPos];
                    IVar8 = s->rTPos + 1;
                    if (IVar8 == 0x200) {
                      IVar8 = 0;
                    }
                    s->rTPos = IVar8;
                  }
                  iVar14 = s->rNToGo + -1;
                  s->rNToGo = iVar14;
                  s->nblock_used = iVar6 + 1;
                  if (iVar6 != iVar17) {
                    uVar11 = uVar11 & 0xff ^ (uint)(iVar14 == 1);
                    if (uVar11 == uVar22) {
                      s->state_out_len = 2;
                      if (uVar20 <= uVar25) {
                        return -4;
                      }
                      uVar11 = 0;
                      uVar7 = 0x100;
                      do {
                        uVar16 = (int)(uVar11 + uVar7) >> 1;
                        uVar12 = uVar16;
                        if (s->cftab[(int)uVar16] <= (int)uVar25) {
                          uVar12 = uVar7;
                          uVar11 = uVar16;
                        }
                        uVar7 = uVar12;
                      } while (uVar7 - uVar11 != 1);
                      uVar3 = pUVar4[uVar25];
                      uVar25 = (pUVar13[uVar25 >> 1] >> (((byte)uVar2 & 1) << 2) & 0xf) << 0x10 |
                               (uint)uVar3;
                      s->tPos = uVar25;
                      if (iVar14 == 0) {
                        s->rNToGo = BZ2_rNums[s->rTPos];
                        IVar8 = s->rTPos + 1;
                        if (IVar8 == 0x200) {
                          IVar8 = 0;
                        }
                        s->rTPos = IVar8;
                      }
                      iVar14 = s->rNToGo + -1;
                      s->rNToGo = iVar14;
                      s->nblock_used = iVar6 + 2;
                      if (iVar6 + 1 != iVar17) {
                        uVar11 = uVar11 & 0xff ^ (uint)(iVar14 == 1);
                        if (uVar11 == uVar22) {
                          s->state_out_len = 3;
                          if (uVar20 <= uVar25) {
                            return -4;
                          }
                          uVar11 = 0;
                          uVar7 = 0x100;
                          do {
                            uVar16 = (int)(uVar11 + uVar7) >> 1;
                            uVar12 = uVar16;
                            if (s->cftab[(int)uVar16] <= (int)uVar25) {
                              uVar12 = uVar7;
                              uVar11 = uVar16;
                            }
                            uVar7 = uVar12;
                          } while (uVar7 - uVar11 != 1);
                          uVar2 = pUVar4[uVar25];
                          uVar25 = (pUVar13[uVar25 >> 1] >>
                                    (sbyte)(((ulong)uVar3 & 0x3fffffffffffffc1) << 2) & 0xf) << 0x10
                                   | (uint)uVar2;
                          s->tPos = uVar25;
                          if (iVar14 == 0) {
                            s->rNToGo = BZ2_rNums[s->rTPos];
                            IVar8 = s->rTPos + 1;
                            if (IVar8 == 0x200) {
                              IVar8 = 0;
                            }
                            s->rTPos = IVar8;
                          }
                          iVar14 = s->rNToGo + -1;
                          s->rNToGo = iVar14;
                          s->nblock_used = iVar6 + 3;
                          if (iVar6 + 2 != iVar17) {
                            uVar11 = uVar11 & 0xff ^ (uint)(iVar14 == 1);
                            if (uVar11 != uVar22) goto LAB_0049d9d6;
                            if (uVar20 <= uVar25) {
                              return -4;
                            }
                            uVar22 = 0;
                            uVar11 = 0x100;
                            do {
                              uVar12 = (int)(uVar22 + uVar11) >> 1;
                              uVar7 = uVar12;
                              if (s->cftab[(int)uVar12] <= (int)uVar25) {
                                uVar7 = uVar11;
                                uVar22 = uVar12;
                              }
                              uVar11 = uVar7;
                            } while (uVar11 - uVar22 != 1);
                            uVar3 = pUVar4[uVar25];
                            uVar25 = (pUVar13[uVar25 >> 1] >>
                                      (sbyte)(((ulong)uVar2 & 0x3fffffffffffffc1) << 2) & 0xf) <<
                                     0x10 | (uint)uVar3;
                            s->tPos = uVar25;
                            if (iVar14 == 0) {
                              s->rNToGo = BZ2_rNums[s->rTPos];
                              IVar8 = s->rTPos + 1;
                              if (IVar8 == 0x200) {
                                IVar8 = 0;
                              }
                              s->rTPos = IVar8;
                            }
                            iVar14 = s->rNToGo + -1;
                            s->rNToGo = iVar14;
                            s->nblock_used = iVar6 + 4;
                            s->state_out_len = (uVar22 & 0xff ^ (uint)(iVar14 == 1)) + 4;
                            if (uVar20 <= uVar25) {
                              return -4;
                            }
                            uVar22 = 0;
                            uVar20 = 0x100;
                            do {
                              uVar11 = (int)(uVar22 + uVar20) >> 1;
                              if (s->cftab[(int)uVar11] <= (int)uVar25) {
                                uVar22 = uVar11;
                                uVar11 = uVar20;
                              }
                              uVar20 = uVar11;
                            } while (uVar20 - uVar22 != 1);
                            s->k0 = uVar22;
                            s->tPos = (pUVar13[uVar25 >> 1] >>
                                       (sbyte)(((ulong)uVar3 & 0x3fffffffffffffc1) << 2) & 0xf) <<
                                      0x10 | (uint)pUVar4[uVar25];
                            if (iVar14 == 0) {
                              s->rNToGo = BZ2_rNums[s->rTPos];
                              IVar8 = s->rTPos + 1;
                              if (IVar8 == 0x200) {
                                IVar8 = 0;
                              }
                              s->rTPos = IVar8;
                            }
                            iVar14 = s->rNToGo + -1;
                            s->rNToGo = iVar14;
                            s->k0 = uVar22 ^ iVar14 == 1;
                            s->nblock_used = iVar6 + 5;
                          }
                        }
                        else {
LAB_0049d9d6:
                          s->k0 = uVar11;
                        }
                      }
                    }
                    else {
                      s->k0 = uVar11;
                    }
                  }
                  pbVar9 = s->strm;
                  if (pbVar9->avail_out == 0) goto LAB_0049e310;
                }
                *pbVar9->next_out = s->state_out_ch;
                s->calculatedBlockCRC =
                     s->calculatedBlockCRC << 8 ^
                     BZ2_crc32Table[(uint)s->state_out_ch ^ s->calculatedBlockCRC >> 0x18];
                s->state_out_len = s->state_out_len + -1;
                pbVar9 = s->strm;
                pbVar9->next_out = pbVar9->next_out + 1;
                uVar25 = pbVar9->avail_out - 1;
                pbVar9->avail_out = uVar25;
                puVar1 = &pbVar9->total_out_lo32;
                *puVar1 = *puVar1 + 1;
                if (*puVar1 == 0) {
                  pbVar9->total_out_hi32 = pbVar9->total_out_hi32 + 1;
                }
              }
            }
          }
LAB_0049e310:
          if (s->nblock_used != s->save_nblock + 1) {
            return 0;
          }
          if (s->state_out_len != 0) {
            return 0;
          }
          s->calculatedBlockCRC = ~s->calculatedBlockCRC;
          if (2 < s->verbosity) {
            fprintf(_stderr," {0x%08x, 0x%08x}",(ulong)s->storedBlockCRC);
          }
          if (1 < s->verbosity) {
            fputc(0x5d,_stderr);
          }
          if (s->calculatedBlockCRC != s->storedBlockCRC) {
            return -4;
          }
          s->calculatedCombinedCRC =
               (s->calculatedCombinedCRC << 1 | (uint)((int)s->calculatedCombinedCRC < 0)) ^
               s->calculatedBlockCRC;
          s->state = 0xe;
        }
        else if (s->state == 1) {
          return -1;
        }
      } while (s->state < 10);
      IVar8 = BZ2_decompress(s);
      if (IVar8 == 4) {
        if (2 < s->verbosity) {
          fprintf(_stderr,"\n    combined CRCs: stored = 0x%08x, computed = 0x%08x",
                  (ulong)s->storedCombinedCRC,(ulong)s->calculatedCombinedCRC);
        }
        bVar26 = false;
        iVar14 = (uint)(s->calculatedCombinedCRC == s->storedCombinedCRC) * 8 + -4;
      }
      else {
        bVar26 = s->state == 2;
        iVar14 = local_40;
        if (!bVar26) {
          iVar14 = IVar8;
        }
      }
      local_40 = iVar14;
    } while (bVar26);
  }
  return iVar14;
}

Assistant:

int BZ_API(BZ2_bzDecompress) ( bz_stream *strm )
{
   Bool    corrupt;
   DState* s;
   if (strm == NULL) return BZ_PARAM_ERROR;
   s = strm->state;
   if (s == NULL) return BZ_PARAM_ERROR;
   if (s->strm != strm) return BZ_PARAM_ERROR;

   while (True) {
      if (s->state == BZ_X_IDLE) return BZ_SEQUENCE_ERROR;
      if (s->state == BZ_X_OUTPUT) {
         if (s->smallDecompress)
            corrupt = unRLE_obuf_to_output_SMALL ( s ); else
            corrupt = unRLE_obuf_to_output_FAST  ( s );
         if (corrupt) return BZ_DATA_ERROR;
         if (s->nblock_used == s->save_nblock+1 && s->state_out_len == 0) {
            BZ_FINALISE_CRC ( s->calculatedBlockCRC );
            if (s->verbosity >= 3) 
               VPrintf2 ( " {0x%08x, 0x%08x}", s->storedBlockCRC, 
                          s->calculatedBlockCRC );
            if (s->verbosity >= 2) VPrintf0 ( "]" );
            if (s->calculatedBlockCRC != s->storedBlockCRC)
               return BZ_DATA_ERROR;
            s->calculatedCombinedCRC 
               = (s->calculatedCombinedCRC << 1) | 
                    (s->calculatedCombinedCRC >> 31);
            s->calculatedCombinedCRC ^= s->calculatedBlockCRC;
            s->state = BZ_X_BLKHDR_1;
         } else {
            return BZ_OK;
         }
      }
      if (s->state >= BZ_X_MAGIC_1) {
         Int32 r = BZ2_decompress ( s );
         if (r == BZ_STREAM_END) {
            if (s->verbosity >= 3)
               VPrintf2 ( "\n    combined CRCs: stored = 0x%08x, computed = 0x%08x", 
                          s->storedCombinedCRC, s->calculatedCombinedCRC );
            if (s->calculatedCombinedCRC != s->storedCombinedCRC)
               return BZ_DATA_ERROR;
            return r;
         }
         if (s->state != BZ_X_OUTPUT) return r;
      }
   }

   AssertH ( 0, 6001 );

   return 0;  /*NOTREACHED*/
}